

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddTweak
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,TweakMethod tweak)

{
  string *file;
  ostream *poVar1;
  Indent IVar2;
  int iVar3;
  cmInstallTargetGenerator *this_00;
  pointer file_00;
  int iVar4;
  char *in_stack_00000008;
  string tws;
  ostringstream tw;
  string local_1f8;
  pointer local_1d8;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  file = (files->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_1d8 = (pointer)files;
  if ((long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)file == 0x20) {
    GetDestDirPath((string *)local_1a8,(cmInstallTargetGenerator *)os,file);
    AddTweak(this,os,indent,config,(string *)local_1a8,tweak);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  else {
    local_1b0 = config;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"${file}","");
    local_1d0._M_dataplus._M_p = in_stack_00000008;
    local_1d0._M_string_length = (size_type)tws._M_dataplus._M_p;
    AddTweak(this,(ostream *)local_1a8,(Indent)(indent.Level + 2),local_1b0,&local_1f8,tweak);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    if (local_1f8._M_string_length != 0) {
      IVar2.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar2.Level = IVar2.Level + -1;
        } while (IVar2.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"foreach(file\n",0xd);
      iVar4 = indent.Level + 4;
      file_00 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1d8->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      local_1d8 = (pointer)local_1d8->_M_string_length;
      if (file_00 != local_1d8) {
        do {
          iVar3 = iVar4;
          if (-4 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          this_00 = (cmInstallTargetGenerator *)0x564d83;
          std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
          GetDestDirPath(&local_1d0,this_00,file_00);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          file_00 = file_00 + 1;
        } while (file_00 != local_1d8);
      }
      if (-4 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          indent.Level = indent.Level + -1;
        } while (indent.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endforeach()\n",0xd);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddTweak(std::ostream& os, Indent indent,
                                        const std::string& config,
                                        std::vector<std::string> const& files,
                                        TweakMethod tweak)
{
  if (files.size() == 1) {
    // Tweak a single file.
    this->AddTweak(os, indent, config, this->GetDestDirPath(files[0]), tweak);
  } else {
    // Generate a foreach loop to tweak multiple files.
    std::ostringstream tw;
    this->AddTweak(tw, indent.Next(), config, "${file}", tweak);
    std::string tws = tw.str();
    if (!tws.empty()) {
      Indent indent2 = indent.Next().Next();
      os << indent << "foreach(file\n";
      for (std::string const& f : files) {
        os << indent2 << "\"" << this->GetDestDirPath(f) << "\"\n";
      }
      os << indent2 << ")\n";
      os << tws;
      os << indent << "endforeach()\n";
    }
  }
}